

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O0

float __thiscall
embree::ParallelIntersectBenchmark::benchmark
          (ParallelIntersectBenchmark *this,VerifyApplication *state)

{
  bool bVar1;
  runtime_error *this_00;
  unsigned_long in_RSI;
  anon_class_8_1_898bcfc2_conflict7 *in_RDI;
  double step;
  double dVar2;
  double t1;
  double t0;
  task_group_context context;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  task_group_context *in_stack_ffffffffffffff30;
  anon_class_8_1_898bcfc2_conflict7 *f;
  anon_class_8_1_898bcfc2_conflict7 *first;
  
  first = in_RDI;
  step = getSeconds();
  f = in_RDI;
  tbb::detail::d1::task_group_context::task_group_context
            ((task_group_context *)0x0,(kind_type)((ulong)in_RDI >> 0x20),
             CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  tbb::detail::d1::
  parallel_for<unsigned_long,embree::parallel_for<unsigned_long,embree::ParallelIntersectBenchmark::benchmark(embree::VerifyApplication*)::_lambda(unsigned_long)_1_>(unsigned_long,embree::ParallelIntersectBenchmark::benchmark(embree::VerifyApplication*)::_lambda(unsigned_long)_1_const&)::_lambda(unsigned_long)_1_>
            ((unsigned_long)first,in_RSI,(unsigned_long)step,f,in_stack_ffffffffffffff30);
  bVar1 = tbb::detail::d1::task_group_context::is_group_execution_cancelled
                    ((task_group_context *)0x1e8f1a);
  if (!bVar1) {
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)0x1e8faa);
    dVar2 = getSeconds();
    return ((float)*(uint *)&in_RDI[0xf].func * 1e-06) / (float)(dVar2 - step);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

float benchmark(VerifyApplication* state)
    {
      double t0 = getSeconds();
      parallel_for((size_t)N/dN, [&](size_t i) {
          render_block(i*dN, dN);
      });
      double t1 = getSeconds();
      return 1E-6f * (float)(N)/float(t1-t0);
    }